

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O2

int __thiscall helics::Input::getValue(Input *this,double *data,int maxsize)

{
  pointer __src;
  int iVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  int iVar3;
  
  pvVar2 = getValueRef<std::vector<double,std::allocator<double>>>(this);
  iVar3 = 0;
  if (0 < maxsize && data != (double *)0x0) {
    __src = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
    iVar1 = (int)((ulong)((long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)__src) >> 3);
    iVar3 = maxsize;
    if (iVar1 < maxsize) {
      iVar3 = iVar1;
    }
    memmove(data,__src,(long)iVar3 << 3);
  }
  this->hasUpdate = false;
  return iVar3;
}

Assistant:

int Input::getValue(double* data, int maxsize)
{
    const auto& V = getValueRef<std::vector<double>>();
    int length = 0;
    if (data != nullptr && maxsize > 0) {
        length = std::min(static_cast<int>(V.size()), maxsize);
        std::memmove(data, V.data(), length * sizeof(double));
    }

    hasUpdate = false;
    return length;
}